

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O3

int LWZReadByte(gdIOCtx *fd,LZW_STATIC_DATA *sd,char flag,int input_code_size,int *ZeroDataBlockP)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  int *piVar7;
  ulong uVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uchar buf [260];
  uchar local_138 [264];
  
  if (flag == '\0') {
    if (sd->fresh != 0) {
      sd->fresh = 0;
      do {
        iVar6 = GetCode(fd,&sd->scd,sd->code_size,0,ZeroDataBlockP);
        sd->oldcode = iVar6;
        sd->firstcode = iVar6;
      } while (iVar6 == sd->clear_code);
      return iVar6;
    }
    piVar7 = sd->sp;
    piVar1 = sd->stack;
    if (piVar1 < piVar7) {
      sd->sp = piVar7 + -1;
      return piVar7[-1];
    }
    while( true ) {
      uVar5 = GetCode(fd,&sd->scd,sd->code_size,0,ZeroDataBlockP);
      if ((int)uVar5 < 0) {
        return uVar5;
      }
      if (uVar5 == sd->clear_code) break;
      if (uVar5 == sd->end_code) {
        if (*ZeroDataBlockP != 0) {
          return -2;
        }
        do {
          iVar6 = GetDataBlock(fd,local_138,ZeroDataBlockP);
        } while (0 < iVar6);
        if (iVar6 != 0) {
          return -2;
        }
      }
      piVar7 = sd->sp;
      if (piVar7 == (int *)&sd->field_0x10024) {
        return -1;
      }
      uVar10 = uVar5;
      if (sd->max_code <= (int)uVar5) {
        sd->sp = piVar7 + 1;
        *piVar7 = sd->firstcode;
        piVar7 = piVar7 + 1;
        uVar10 = sd->oldcode;
      }
      piVar9 = piVar7;
      if (sd->clear_code <= (int)uVar10) {
        do {
          if (piVar9 == (int *)&sd->field_0x10024) {
            return -1;
          }
          iVar6 = sd->table[1][(int)uVar10];
          piVar7 = piVar9 + 1;
          sd->sp = piVar7;
          *piVar9 = iVar6;
          uVar10 = sd->table[0][(int)uVar10];
          piVar9 = piVar7;
        } while (sd->clear_code <= (int)uVar10);
      }
      iVar6 = sd->table[1][(int)uVar10];
      sd->firstcode = iVar6;
      sd->sp = piVar7 + 1;
      *piVar7 = iVar6;
      lVar12 = (long)sd->max_code;
      if (lVar12 < 0x1000) {
        sd->table[0][lVar12] = sd->oldcode;
        sd->table[1][lVar12] = sd->firstcode;
        iVar6 = sd->max_code_size;
        iVar13 = sd->max_code + 1;
        sd->max_code = iVar13;
        if (iVar6 < 0x1000 && iVar6 <= iVar13) {
          sd->max_code_size = iVar6 * 2;
          sd->code_size = sd->code_size + 1;
        }
      }
      sd->oldcode = uVar5;
      if (piVar1 < piVar7 + 1) {
        sd->sp = piVar7;
        return *piVar7;
      }
    }
    if (uVar5 == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)uVar5;
      uVar8 = 0;
      do {
        sd->table[0][uVar8] = 0;
        sd->table[1][uVar8] = (int)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar11 != uVar8);
      if (0xfff < uVar5) goto LAB_001177a6;
    }
    lVar12 = uVar11 - 0x1000;
    do {
      sd->stack[lVar12] = 0;
      sd->table[1][lVar12] = 0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0);
LAB_001177a6:
    iVar6 = sd->set_code_size + 1;
    sd->code_size = iVar6;
    sd->max_code_size = uVar5 * 2;
    sd->max_code = uVar5 + 2;
    sd->sp = piVar1;
    iVar6 = GetCode(fd,&sd->scd,iVar6,0,ZeroDataBlockP);
    sd->oldcode = iVar6;
    sd->firstcode = iVar6;
    return iVar6;
  }
  sd->set_code_size = input_code_size;
  sd->code_size = input_code_size + 1;
  uVar5 = 1 << ((byte)input_code_size & 0x1f);
  sd->clear_code = uVar5;
  sd->end_code = uVar5 + 1;
  sd->max_code_size = 2 << ((byte)input_code_size & 0x1f);
  sd->max_code = uVar5 + 2;
  (sd->scd).curbit = 0;
  (sd->scd).lastbit = 0;
  (sd->scd).done = 0;
  (sd->scd).last_byte = 2;
  sd->fresh = 1;
  uVar11 = 0;
  if (input_code_size != 0x1f) {
    uVar11 = 1;
    if (1 < (int)uVar5) {
      uVar11 = (ulong)uVar5;
    }
    uVar8 = 0;
    do {
      sd->table[0][uVar8] = 0;
      sd->table[1][uVar8] = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
    if (0xfff < (int)uVar5) goto LAB_0011756c;
  }
  auVar4 = _DAT_00125df0;
  auVar3 = _DAT_00124050;
  auVar2 = _DAT_00124040;
  lVar12 = 0xfff - uVar11;
  auVar14._8_4_ = (int)lVar12;
  auVar14._0_8_ = lVar12;
  auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
  uVar8 = 0;
  auVar14 = auVar14 ^ _DAT_00124050;
  do {
    auVar15._8_4_ = (int)uVar8;
    auVar15._0_8_ = uVar8;
    auVar15._12_4_ = (int)(uVar8 >> 0x20);
    auVar16 = (auVar15 | auVar2) ^ auVar3;
    iVar6 = auVar14._4_4_;
    sd->table[1][0] = 0;
    if ((bool)(~(auVar16._4_4_ == iVar6 && auVar14._0_4_ < auVar16._0_4_ || iVar6 < auVar16._4_4_) &
              1)) {
      sd->table[0][uVar11 + uVar8] = 0;
    }
    if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
        auVar16._12_4_ <= auVar14._12_4_) {
      sd->table[0][uVar11 + uVar8 + 1] = 0;
    }
    auVar15 = (auVar15 | auVar4) ^ auVar3;
    iVar13 = auVar15._4_4_;
    if (iVar13 <= iVar6 && (iVar13 != iVar6 || auVar15._0_4_ <= auVar14._0_4_)) {
      sd->table[0][uVar11 + uVar8 + 2] = 0;
      sd->table[0][uVar11 + uVar8 + 3] = 0;
    }
    uVar8 = uVar8 + 4;
  } while ((0x1003 - uVar11 & 0xfffffffffffffffc) != uVar8);
LAB_0011756c:
  sd->sp = sd->stack;
  return 0;
}

Assistant:

static int
LWZReadByte(gdIOCtx *fd, LZW_STATIC_DATA *sd, char flag, int input_code_size, int *ZeroDataBlockP)
{
	int rv;

	rv = LWZReadByte_(fd, sd, flag, input_code_size, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[LWZReadByte(,%d,%d) returning %d]\n",flag,input_code_size,rv);
	}

	return rv;
}